

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

int32_t __thiscall
fasttext::Dictionary::getLine
          (Dictionary *this,istream *in,vector<int,_std::allocator<int>_> *words,
          vector<int,_std::allocator<int>_> *labels)

{
  pointer piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  entry_type eVar5;
  __type _Var6;
  uint32_t h;
  int32_t id;
  int32_t iVar7;
  Dictionary *this_00;
  string_view str;
  string_view w;
  string_view w_00;
  string_view token_00;
  string token;
  vector<int,_std::allocator<int>_> word_hashes;
  uint32_t local_84;
  vector<int,_std::allocator<int>_> *local_80;
  undefined1 local_78 [32];
  _Vector_base<int,_std::allocator<int>_> local_58;
  pointer local_40;
  istream *local_38;
  
  local_78._0_8_ = local_78 + 0x10;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78[0x10] = 0;
  this_00 = this;
  local_38 = in;
  reset(this,in);
  piVar1 = (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  piVar1 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  iVar7 = 0;
  local_80 = words;
  local_40 = (pointer)labels;
  do {
    bVar4 = readWord(this_00,local_38,(string *)local_78);
    uVar3 = local_78._8_8_;
    uVar2 = local_78._0_8_;
    if (!bVar4) break;
    str._M_str = (char *)local_78._0_8_;
    str._M_len = local_78._8_8_;
    h = hash(this_00,str);
    w._M_str = (char *)uVar2;
    w._M_len = uVar3;
    id = getId(this,w,h);
    if (id < 0) {
      w_00._M_str = (char *)local_78._0_8_;
      w_00._M_len = local_78._8_8_;
      eVar5 = getType(this,w_00);
    }
    else {
      eVar5 = getType(this,id);
    }
    if (eVar5 == word) {
      token_00._M_str = (char *)local_78._0_8_;
      token_00._M_len = local_78._8_8_;
      addSubwords(this,local_80,token_00,id);
      local_84 = h;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&local_58,(int *)&local_84);
    }
    else if (-1 < id && eVar5 == label) {
      local_84 = id - this->nwords_;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)local_40,(int *)&local_84);
    }
    this_00 = (Dictionary *)local_78;
    _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&EOS_abi_cxx11_);
    iVar7 = iVar7 + 1;
  } while (!_Var6);
  addWordNgrams(this,local_80,(vector<int,_std::allocator<int>_> *)&local_58,
                ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->wordNgrams);
  std::__cxx11::string::~string((string *)local_78);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  return iVar7;
}

Assistant:

int32_t Dictionary::getLine(
    std::istream& in,
    std::vector<int32_t>& words,
    std::vector<int32_t>& labels) const {
  std::vector<int32_t> word_hashes;
  std::string token;
  int32_t ntokens = 0;

  reset(in);
  words.clear();
  labels.clear();
  while (readWord(in, token)) {
    uint32_t h = hash(token);
    int32_t wid = getId(token, h);
    entry_type type = wid < 0 ? getType(token) : getType(wid);

    ntokens++;
    if (type == entry_type::word) {
      addSubwords(words, token, wid);
      word_hashes.push_back(h);
    } else if (type == entry_type::label && wid >= 0) {
      labels.push_back(wid - nwords_);
    }
    if (token == EOS) {
      break;
    }
  }
  addWordNgrams(words, word_hashes, args_->wordNgrams);
  return ntokens;
}